

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void __thiscall zsummer::log4z::CLogerManager::Config(CLogerManager *this)

{
  char *in_RSI;
  
  Config((CLogerManager *)&this[-1].m_ullStatusTotalPushLog,in_RSI);
  return;
}

Assistant:

bool Config(const char* cfgPath)
	{
		if (!m_configFile.empty())
		{
			std::cout << "log4z configure error: too many too call Config. the old config file="<< m_configFile << ", the new config file=" << cfgPath << std::endl;
			return false;
		}
		m_configFile = cfgPath;
		std::map<std::string, LoggerInfo> loggerMap;
		ParseConfig(cfgPath, loggerMap);
		for (std::map<std::string, LoggerInfo>::iterator iter = loggerMap.begin(); iter != loggerMap.end(); ++iter)
		{
			CreateLogger(iter->second._name.c_str(),
				iter->second._path.c_str(),
				iter->second._level,
				iter->second._display,
				iter->second._monthdir,
				iter->second._limitsize);
		}
		return true;
	}